

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::parse_not(CTcPrsNode *subexpr)

{
  CTcPrsNode *pCVar1;
  
  pCVar1 = eval_const_not(subexpr);
  if (pCVar1 == (CTcPrsNode *)0x0) {
    pCVar1 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
    pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)subexpr;
    (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031d3d8;
  }
  return pCVar1;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_not(CTcPrsNode *subexpr)
{
    /* try folding a constant value */
    CTcPrsNode *ret = eval_const_not(subexpr);

    /* 
     *   if we got a constant result, return it; otherwise, create a NOT
     *   node for code generation 
     */
    if (ret != 0)
        return ret;
    else
        return new CTPNNot(subexpr);
}